

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::MaybeEmitReceivedTriggers
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  value_type *pvVar1;
  TracePacket *pTVar2;
  Trigger *pTVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  string local_148;
  string local_128;
  Trigger *local_f8;
  Trigger *trigger;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  value_type *info;
  size_t i;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets_local;
  TracingSession *tracing_session_local;
  TracingServiceImpl *this_local;
  
  info = (value_type *)tracing_session->num_triggers_emitted_into_trace;
  while( true ) {
    pvVar1 = (value_type *)
             std::
             vector<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
             ::size(&tracing_session->received_triggers);
    if (pvVar1 <= info) break;
    packet.msg_.root_arena_.blocks_.
    super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
    ._M_impl._M_node._M_size =
         (size_t)std::
                 vector<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
                 ::operator[](&tracing_session->received_triggers,(size_type)info);
    protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
              ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    pTVar2 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    pTVar3 = protos::pbzero::TracePacket::set_trigger<perfetto::protos::pbzero::Trigger>(pTVar2);
    local_f8 = pTVar3;
    ::std::__cxx11::string::string
              ((string *)&local_128,
               (string *)
               (packet.msg_.root_arena_.blocks_.
                super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
                ._M_impl._M_node._M_size + 8));
    protos::pbzero::Trigger::set_trigger_name(pTVar3,&local_128);
    ::std::__cxx11::string::~string((string *)&local_128);
    pTVar3 = local_f8;
    ::std::__cxx11::string::string
              ((string *)&local_148,
               (string *)
               (packet.msg_.root_arena_.blocks_.
                super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
                ._M_impl._M_node._M_size + 0x28));
    protos::pbzero::Trigger::set_producer_name(pTVar3,&local_148);
    ::std::__cxx11::string::~string((string *)&local_148);
    protos::pbzero::Trigger::set_trusted_producer_uid
              (local_f8,*(int32_t *)
                         (packet.msg_.root_arena_.blocks_.
                          super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
                          ._M_impl._M_node._M_size + 0x48));
    pTVar2 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    protos::pbzero::TracePacket::set_timestamp
              (pTVar2,*(uint64_t *)
                       packet.msg_.root_arena_.blocks_.
                       super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
                       ._M_impl._M_node._M_size);
    pTVar2 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    protos::pbzero::TracePacket::set_trusted_uid(pTVar2,this->uid_);
    pTVar2 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                       ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    protos::pbzero::TracePacket::set_trusted_packet_sequence_id(pTVar2,1);
    protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::SerializeAsArray
              (&local_160,(HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    anon_unknown_4::SerializeAndAppendPacket(packets,&local_160);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_160);
    tracing_session->num_triggers_emitted_into_trace =
         tracing_session->num_triggers_emitted_into_trace + 1;
    protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::~HeapBuffered
              ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)&trigger);
    info = (value_type *)((long)&info->boot_time_ns + 1);
  }
  return;
}

Assistant:

void TracingServiceImpl::MaybeEmitReceivedTriggers(
    TracingSession* tracing_session,
    std::vector<TracePacket>* packets) {
  PERFETTO_DCHECK(tracing_session->num_triggers_emitted_into_trace <=
                  tracing_session->received_triggers.size());
  for (size_t i = tracing_session->num_triggers_emitted_into_trace;
       i < tracing_session->received_triggers.size(); ++i) {
    const auto& info = tracing_session->received_triggers[i];
    protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
    auto* trigger = packet->set_trigger();
    trigger->set_trigger_name(info.trigger_name);
    trigger->set_producer_name(info.producer_name);
    trigger->set_trusted_producer_uid(static_cast<int32_t>(info.producer_uid));

    packet->set_timestamp(info.boot_time_ns);
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
    SerializeAndAppendPacket(packets, packet.SerializeAsArray());
    ++tracing_session->num_triggers_emitted_into_trace;
  }
}